

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  FadExpr<FadBinaryMinus<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *pFVar5;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>_>_>
  *pFVar6;
  Fad<double> *pFVar7;
  Fad<double> *pFVar8;
  double *pdVar9;
  ulong uVar10;
  ulong uVar11;
  double *pdVar12;
  double *pdVar13;
  long lVar14;
  
  pFVar5 = (((fadexpr->fadexpr_).left_)->fadexpr_).right_;
  uVar1 = (((((pFVar5->fadexpr_).left_)->fadexpr_).expr_)->dx_).num_elts;
  uVar2 = (((pFVar5->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar10 = (ulong)uVar2;
  uVar1 = (this->dx_).num_elts;
  if (uVar2 != uVar1) {
    if (uVar2 == 0) {
      if (uVar1 != 0) {
        pdVar9 = (this->dx_).ptr_to_data;
        if (pdVar9 != (double *)0x0) {
          operator_delete__(pdVar9);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar1 != 0) {
        pdVar9 = (this->dx_).ptr_to_data;
        if (pdVar9 != (double *)0x0) {
          operator_delete__(pdVar9);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar2;
      uVar11 = 0xffffffffffffffff;
      if (-1 < (int)uVar2) {
        uVar11 = (long)(int)uVar2 << 3;
      }
      pdVar9 = (double *)operator_new__(uVar11);
      (this->dx_).ptr_to_data = pdVar9;
    }
  }
  if (uVar2 != 0) {
    pdVar9 = (this->dx_).ptr_to_data;
    pFVar6 = (fadexpr->fadexpr_).left_;
    pFVar5 = (pFVar6->fadexpr_).right_;
    pFVar7 = (((pFVar5->fadexpr_).left_)->fadexpr_).expr_;
    iVar3 = (pFVar7->dx_).num_elts;
    if ((iVar3 == 0) || ((((pFVar5->fadexpr_).right_)->dx_).num_elts == 0)) {
      if (0 < (int)uVar2) {
        pFVar8 = (pFVar5->fadexpr_).right_;
        iVar4 = (pFVar8->dx_).num_elts;
        lVar14 = 0;
        do {
          pdVar12 = (double *)((long)(pFVar7->dx_).ptr_to_data + lVar14);
          if (iVar3 == 0) {
            pdVar12 = &pFVar7->defaultVal;
          }
          pdVar13 = (double *)((long)(pFVar8->dx_).ptr_to_data + lVar14);
          if (iVar4 == 0) {
            pdVar13 = &pFVar8->defaultVal;
          }
          *(double *)((long)pdVar9 + lVar14) =
               ((-*pdVar12 - *pdVar13) * (pFVar6->fadexpr_).left_.constant_) /
               (fadexpr->fadexpr_).right_.constant_;
          lVar14 = lVar14 + 8;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
    }
    else if (0 < (int)uVar2) {
      pdVar12 = (pFVar7->dx_).ptr_to_data;
      pdVar13 = (((pFVar5->fadexpr_).right_)->dx_).ptr_to_data;
      uVar11 = 0;
      do {
        pdVar9[uVar11] =
             ((-pdVar12[uVar11] - pdVar13[uVar11]) * (pFVar6->fadexpr_).left_.constant_) /
             (fadexpr->fadexpr_).right_.constant_;
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
  }
  pFVar6 = (fadexpr->fadexpr_).left_;
  pFVar5 = (pFVar6->fadexpr_).right_;
  this->val_ = ((-((((pFVar5->fadexpr_).left_)->fadexpr_).expr_)->val_ -
                ((pFVar5->fadexpr_).right_)->val_) * (pFVar6->fadexpr_).left_.constant_) /
               (fadexpr->fadexpr_).right_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}